

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.hpp
# Opt level: O2

string * cs_impl::to_string<cs::numeric>(string *__return_storage_ptr__,numeric *val)

{
  longdouble lVar1;
  string str;
  stringstream ss;
  char *local_1c0;
  size_type local_1b8;
  char local_1b0;
  undefined7 uStack_1af;
  undefined8 uStack_1a8;
  stringstream local_1a0 [16];
  long local_190;
  long alStack_188 [46];
  
  if (val->type == false) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    local_1b8 = 0;
    local_1b0 = '\0';
    *(long *)((long)alStack_188 + *(long *)(local_190 + -0x18)) =
         (long)*(int *)(cs::current_process + 0x50);
    lVar1 = *(longdouble *)&val->data;
    if (val->type != false) {
      lVar1 = (longdouble)(val->data)._int;
    }
    local_1c0 = &local_1b0;
    std::ostream::_M_insert<long_double>(lVar1);
    std::operator>>((istream *)local_1a0,(string *)&local_1c0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_1c0 == &local_1b0) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1af,local_1b0);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1a8;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_1c0;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1af,local_1b0);
    }
    __return_storage_ptr__->_M_string_length = local_1b8;
    local_1b8 = 0;
    local_1b0 = '\0';
    local_1c0 = &local_1b0;
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  else {
    std::__cxx11::to_string(__return_storage_ptr__,(val->data)._int);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string<cs::numeric>(const cs::numeric &val)
	{
		if (!val.is_integer()) {
			std::stringstream ss;
			std::string str;
			ss << std::setprecision(cs::current_process->output_precision) << val.as_float();
			ss >> str;
			return std::move(str);
		}
		else
			return std::to_string(val.as_integer());
	}